

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_empty_env(void)

{
  int iVar1;
  char *pcVar2;
  uv_loop_t *puVar3;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char *env [1];
  
  pcVar2 = getenv("DYLD_LIBRARY_PATH");
  if (((pcVar2 != (char *)0x0) || (pcVar2 = getenv("LD_LIBRARY_PATH"), pcVar2 != (char *)0x0)) ||
     (pcVar2 = getenv("LIBPATH"), pcVar2 != (char *)0x0)) {
    fprintf(_stderr,"%s\n","doesn\'t work with DYLD_LIBRARY_PATH/LD_LIBRARY_PATH/LIBPATH");
    fflush(_stderr);
    return 7;
  }
  init_process_options("spawn_helper1",exit_cb);
  options.env = (char **)&eval_a;
  eval_a = 0;
  puVar3 = uv_default_loop();
  iVar1 = uv_spawn(puVar3,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x102,"uv_spawn(uv_default_loop(), &process, &options)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar3 = uv_default_loop();
  iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
  if ((long)iVar1 == 0) {
    if ((long)exit_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x105,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
      abort();
    }
    if ((long)close_cb_called == 1) {
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if ((long)iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,0x108,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x106,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,0x103,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(spawn_empty_env) {
  char* env[1];

  /* The autotools dynamic library build requires the presence of
   * DYLD_LIBARY_PATH (macOS) or LD_LIBRARY_PATH/LIBPATH (other Unices)
   * in the environment, but of course that doesn't work with
   * the empty environment that we're testing here.
   */
  if (NULL != getenv("DYLD_LIBRARY_PATH") ||
      NULL != getenv("LD_LIBRARY_PATH") ||
      NULL != getenv("LIBPATH")) {
    RETURN_SKIP("doesn't work with DYLD_LIBRARY_PATH/LD_LIBRARY_PATH/LIBPATH");
  }

  init_process_options("spawn_helper1", exit_cb);
  options.env = env;
  env[0] = NULL;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}